

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-option-parser.cc
# Opt level: O3

void __thiscall
OptionParser_MissingArgument_Test::~OptionParser_MissingArgument_Test
          (OptionParser_MissingArgument_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(OptionParser, MissingArgument) {
  std::string error;
  OptionParser parser("prog", "desc");
  parser.AddArgument("arg", OptionParser::ArgumentCount::One,
                     [&](const char* arg) {});
  parser.SetErrorCallback([&](const char* msg) { error = msg; });
  const char* args[] = {"prog name"};
  parser.Parse(1, const_cast<char**>(args));
  EXPECT_EQ(error, "prog: expected arg argument." ERROR_ENDING);
}